

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  size_t sVar1;
  istream *piVar2;
  ostream *poVar3;
  mapped_type *pmVar4;
  iterator iVar5;
  _Node *p_Var6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  unsigned_long_long *puVar10;
  long lVar11;
  mapped_type mVar12;
  ulong uVar13;
  bool bVar14;
  byte bVar15;
  bool bVar16;
  bool bVar17;
  string local_110;
  undefined1 local_f0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nums;
  unsigned_long_long L;
  unsigned_long_long S1;
  unsigned_long_long S2;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  r;
  ulong local_a0;
  unsigned_long_long H;
  string operation;
  undefined1 local_70 [8];
  string n1;
  string n2;
  
  piVar2 = std::istream::_M_extract<unsigned_long_long>(&std::cin);
  std::istream::_M_extract<unsigned_long_long>((ulonglong *)piVar2);
  std::istream::ignore();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_f0,0x14,(allocator_type *)local_70);
  if (local_a0 != 0) {
    uVar8 = 0;
    do {
      local_70 = (undefined1  [8])&n1._M_string_length;
      n1._M_dataplus._M_p = (pointer)0x0;
      n1._M_string_length._0_1_ = 0;
      std::operator>>((istream *)&std::cin,(string *)local_70);
      std::istream::ignore();
      r.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size = uVar8;
      if ((pointer)((long)nums.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage * 0x14) !=
          n1._M_dataplus._M_p) {
        __assert_fail("L*20 == nl",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kvirund[P]codingame/medium/mayan.calculation/main.cpp"
                      ,0x2c,"int main()");
      }
      lVar7 = 0;
      lVar11 = 0;
      do {
        std::__cxx11::string::substr((ulong)((long)&n1.field_2 + 8),(ulong)local_70);
        std::__cxx11::string::_M_append
                  ((char *)((long)&((_Alloc_hider *)local_f0)->_M_p + lVar7),n1.field_2._8_8_);
        if ((size_type *)n1.field_2._8_8_ != &n2._M_string_length) {
          operator_delete((void *)n1.field_2._8_8_,
                          CONCAT71(n2._M_string_length._1_7_,(undefined1)n2._M_string_length) + 1);
        }
        sVar1 = r.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node._M_size;
        lVar11 = lVar11 + 1;
        lVar7 = lVar7 + 0x20;
      } while (lVar11 != 0x14);
      if (local_70 != (undefined1  [8])&n1._M_string_length) {
        operator_delete((void *)local_70,
                        CONCAT71(n1._M_string_length._1_7_,(undefined1)n1._M_string_length) + 1);
      }
      uVar8 = sVar1 + 1;
    } while (uVar8 < local_a0);
  }
  lVar7 = 0;
  mVar12 = 0;
  do {
    *(undefined8 *)(__cxa_finalize + *(long *)(std::cerr + -0x18)) = 2;
    poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,*(char **)((long)&((_Alloc_hider *)local_f0)->_M_p + lVar7),
                        *(long *)((long)((long)local_f0 + 8) + lVar7));
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
             ::operator[](&numbers_abi_cxx11_,
                          (key_type *)((long)&((_Alloc_hider *)local_f0)->_M_p + lVar7));
    *pmVar4 = mVar12;
    mVar12 = mVar12 + 1;
    lVar7 = lVar7 + 0x20;
  } while (mVar12 != 0x14);
  local_70 = (undefined1  [8])&n1._M_string_length;
  n1._M_dataplus._M_p = (pointer)0x0;
  n1._M_string_length._0_1_ = 0;
  std::istream::_M_extract<unsigned_long_long>(&std::cin);
  std::istream::ignore();
  bVar14 = L != 0;
  if (L == 0) {
    uVar8 = 0;
    operation.field_2._8_8_ = 0;
  }
  else {
    operation.field_2._8_8_ = 0;
    uVar13 = 0;
    uVar8 = 0;
    do {
      n1.field_2._8_8_ = &n2._M_string_length;
      n2._M_dataplus._M_p = (pointer)0x0;
      n2._M_string_length._0_1_ = 0;
      std::operator>>((istream *)&std::cin,(string *)(n1.field_2._M_local_buf + 8));
      std::istream::ignore();
      std::__cxx11::string::_M_append(local_70,n1.field_2._8_8_);
      bVar17 = true;
      if (uVar13 % local_a0 + 1 == local_a0) {
        iVar5 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
                ::find(&numbers_abi_cxx11_._M_t,(key_type *)local_70);
        bVar16 = (_Rb_tree_header *)iVar5._M_node ==
                 &numbers_abi_cxx11_._M_t._M_impl.super__Rb_tree_header;
        bVar17 = !bVar16;
        if (bVar16) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Unknown number ",0xf);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(char *)local_70,(long)n1._M_dataplus._M_p);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          operation.field_2._8_8_ = 0xffffffff;
          std::ostream::flush();
        }
        else {
          uVar8 = uVar8 * 0x14 + *(long *)(iVar5._M_node + 2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"IR: ",4);
          poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)&std::cerr);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
          std::__cxx11::string::_M_replace((ulong)local_70,0,n1._M_dataplus._M_p,0x1050f2);
        }
      }
      if ((size_type *)n1.field_2._8_8_ != &n2._M_string_length) {
        operator_delete((void *)n1.field_2._8_8_,
                        CONCAT71(n2._M_string_length._1_7_,(undefined1)n2._M_string_length) + 1);
      }
      if (!bVar17) break;
      uVar13 = uVar13 + 1;
      bVar14 = uVar13 < L;
    } while (bVar14);
  }
  if (bVar14) goto LAB_00103d83;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"First number is ",0x10);
  poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)&std::cerr);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  n1.field_2._8_8_ = &n2._M_string_length;
  n2._M_dataplus._M_p = (pointer)0x0;
  n2._M_string_length._0_1_ = 0;
  std::istream::_M_extract<unsigned_long_long>(&std::cin);
  std::istream::ignore();
  bVar15 = S1 != 0;
  if (S1 == 0) {
    uVar13 = 0;
  }
  else {
    uVar9 = 0;
    uVar13 = 0;
    do {
      r.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size =
           CONCAT71(r.
                    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl._M_node._M_size._1_7_,bVar15);
      H = (unsigned_long_long)&operation._M_string_length;
      operation._M_dataplus._M_p = (pointer)0x0;
      operation._M_string_length._0_1_ = 0;
      std::operator>>((istream *)&std::cin,(string *)&H);
      std::istream::ignore();
      std::__cxx11::string::_M_append(n1.field_2._M_local_buf + 8,H);
      bVar14 = true;
      if (uVar9 % local_a0 + 1 == local_a0) {
        iVar5 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
                ::find(&numbers_abi_cxx11_._M_t,(key_type *)((long)&n1.field_2 + 8));
        bVar17 = (_Rb_tree_header *)iVar5._M_node ==
                 &numbers_abi_cxx11_._M_t._M_impl.super__Rb_tree_header;
        bVar14 = !bVar17;
        if (bVar17) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Unknown number ",0xf);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(char *)n1.field_2._8_8_,
                              (long)n2._M_dataplus._M_p);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          operation.field_2._8_8_ = 0xffffffff;
          std::ostream::flush();
        }
        else {
          lVar7 = *(long *)(iVar5._M_node + 2);
          std::__cxx11::string::_M_replace
                    ((ulong)((long)&n1.field_2 + 8),0,n2._M_dataplus._M_p,0x1050f2);
          uVar13 = uVar13 * 0x14 + lVar7;
        }
      }
      if ((size_type *)H != &operation._M_string_length) {
        operator_delete((void *)H,
                        CONCAT71(operation._M_string_length._1_7_,
                                 (undefined1)operation._M_string_length) + 1);
      }
      if (!bVar14) {
        bVar15 = (byte)r.
                       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl._M_node._M_size;
        break;
      }
      uVar9 = uVar9 + 1;
      bVar15 = uVar9 < S1;
    } while ((bool)bVar15);
  }
  if ((bVar15 & 1) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Second number is ",0x11);
    poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)&std::cerr);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    H = (unsigned_long_long)&operation._M_string_length;
    operation._M_dataplus._M_p = (pointer)0x0;
    operation._M_string_length._0_1_ = 0;
    std::operator>>((istream *)&std::cin,(string *)&H);
    std::istream::ignore();
    switch(*(undefined1 *)H) {
    case 0x2a:
      uVar8 = uVar13 * uVar8;
      break;
    case 0x2b:
      uVar8 = uVar13 + uVar8;
      break;
    default:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unknown operation",0x11);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '8');
      std::ostream::put('8');
      operation.field_2._8_8_ = 0xfffffffd;
      std::ostream::flush();
      goto LAB_00103d4e;
    case 0x2d:
      uVar8 = uVar8 - uVar13;
      break;
    case 0x2f:
      uVar8 = uVar8 / uVar13;
    }
    S2 = (unsigned_long_long)&S2;
    r.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
    r.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)S2;
    do {
      std::ostream::_M_insert<unsigned_long_long>((ulonglong)&std::cerr);
      p_Var6 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
               _M_create_node<std::__cxx11::string_const&>
                         ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&S2,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)local_f0 + (uVar8 % 0x14) * 0x20));
      std::__detail::_List_node_base::_M_hook(&p_Var6->super__List_node_base);
      r.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_prev =
           (_List_node_base *)
           ((long)&(r.
                    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl._M_node.super__List_node_base._M_prev)->_M_next + 1);
      bVar14 = 0x13 < uVar8;
      uVar8 = uVar8 / 0x14;
    } while (bVar14);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
    if ((unsigned_long_long *)S2 != &S2) {
      puVar10 = (unsigned_long_long *)S2;
      do {
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)puVar10[2],puVar10[3]);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_110,puVar10[2],puVar10[3] + puVar10[2]);
        print_number(&local_110,local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        puVar10 = (unsigned_long_long *)*puVar10;
      } while (puVar10 != &S2);
    }
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&S2);
LAB_00103d4e:
    if ((size_type *)H != &operation._M_string_length) {
      operator_delete((void *)H,
                      CONCAT71(operation._M_string_length._1_7_,
                               (undefined1)operation._M_string_length) + 1);
    }
  }
  if ((size_type *)n1.field_2._8_8_ != &n2._M_string_length) {
    operator_delete((void *)n1.field_2._8_8_,
                    CONCAT71(n2._M_string_length._1_7_,(undefined1)n2._M_string_length) + 1);
  }
LAB_00103d83:
  if (local_70 != (undefined1  [8])&n1._M_string_length) {
    operator_delete((void *)local_70,
                    CONCAT71(n1._M_string_length._1_7_,(undefined1)n1._M_string_length) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_f0);
  return (int)operation.field_2._8_8_;
}

Assistant:

int main()
{
    unsigned long long int L;
    unsigned long long int H;
    cin >> L >> H;
    cin.ignore();
    
    std::vector<std::string> nums(20);
    for (unsigned long long int i = 0; i < H; i++)
    {
        string numeral;
        cin >> numeral;
        cin.ignore();
        
        const size_t nl = numeral.length();
        assert(L*20 == nl);
        for (size_t i = 0; i < 20; i++)
        {
            nums[i] += numeral.substr(L*i, L);
        }
    }
    
    for (unsigned long long int i = 0; i < 20; i++)
    {
        cerr.width(2);
        cerr << i << ": " << nums[i] << endl;
        numbers[nums[i]] = i;
    }
    
    unsigned long long int S1;
    unsigned long long int N1 = 0;
    std::string n1;
    cin >> S1;
    cin.ignore();
    for (unsigned long long int i = 0; i < S1; i++)
    {
        string num1Line;
        cin >> num1Line;
        cin.ignore();
        n1 += num1Line;
        if (1 + i % H == H)
        {
            std::map<std::string, unsigned long long int>::const_iterator ni1 = numbers.find(n1);
            if (numbers.end() == ni1)
            {
                cerr << "Unknown number " << n1 << endl;
                return -1;
            }
            N1 = 20*N1 + ni1->second;
            cerr << "IR: " << N1 << endl;
            n1 = "";
        }
    }
    cerr << "First number is " << N1 << endl;
    
    unsigned long long int S2;
    unsigned long long int N2 = 0;
    std::string n2;
    cin >> S2;
    cin.ignore();
    for (unsigned long long int i = 0; i < S2; i++)
    {
        string num2Line;
        cin >> num2Line;
        cin.ignore();
        n2 += num2Line;
        if (1 + i % H == H)
        {
            std::map<std::string, unsigned long long int>::const_iterator ni2 = numbers.find(n2);
            if (numbers.end() == ni2)
            {
                cerr << "Unknown number " << n2 << endl;
                return -1;
            }
            N2 = 20*N2 + ni2->second;
            n2 = "";
        }
    }
    cerr << "Second number is " << N2 << endl;
    
    string operation;
    cin >> operation;
    cin.ignore();
    
    unsigned long long int result;
    switch (operation[0])
    {
        case '+':
            result = N1 + N2;
            break;
            
        case '-':
            result = N1 - N2;
            break;
            
        case '*':
            result = N1*N2;
            break;
            
        case '/':
            result = N1/N2;
            break;
            
        default:
            cerr << "Unknown operation" << endl;
            return -3;
    }
    
    std::list<std::string> r;
    do
    {
        cerr << result % 20;
        r.push_front(nums[result % 20]);
        result /= 20;
    } while (0 < result);
    cerr << endl;
    
    for (std::list<std::string>::const_iterator i = r.begin(); i != r.end(); i++)
    {
        cerr << *i << endl;
        print_number(*i, H);
    }
}